

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U64 ZSTD_rollingHash_append(U64 hash,void *buf,size_t size)

{
  size_t pos;
  BYTE *istart;
  size_t size_local;
  void *buf_local;
  U64 hash_local;
  
  hash_local = hash;
  for (pos = 0; pos < size; pos = pos + 1) {
    hash_local = (long)(int)(*(byte *)((long)buf + pos) + 10) + hash_local * -0x30e44323485a9b9d;
  }
  return hash_local;
}

Assistant:

static U64 ZSTD_rollingHash_append(U64 hash, void const* buf, size_t size)
{
    BYTE const* istart = (BYTE const*)buf;
    size_t pos;
    for (pos = 0; pos < size; ++pos) {
        hash *= prime8bytes;
        hash += istart[pos] + ZSTD_ROLL_HASH_CHAR_OFFSET;
    }
    return hash;
}